

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDecoder.cpp
# Opt level: O0

DecoderResult * ZXing::DataMatrix::DoDecode(BitMatrix *bits)

{
  bool bVar1;
  reference pvVar2;
  DecoderResult *in_RDI;
  bool in_stack_00000097;
  ByteArray *in_stack_00000098;
  int i;
  int *numDataCodewords;
  int j;
  int dataBlocksCount;
  ByteArray resultBytes;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> dataBlocks;
  bool fix259;
  ByteArray codewords;
  Version *version;
  DecoderResult *in_stack_fffffffffffffce8;
  DecoderResult *in_stack_fffffffffffffcf0;
  undefined6 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcfe;
  value_type in_stack_fffffffffffffcff;
  DecoderResult *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  int in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  allocator<char> *in_stack_fffffffffffffd20;
  allocator<char> *paVar3;
  char *in_stack_fffffffffffffd28;
  DecoderResult *this;
  int in_stack_fffffffffffffd74;
  ByteArray *in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd90;
  BitMatrix *in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffddf;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  int local_1ec;
  undefined1 local_1e8 [135];
  allocator<char> local_161;
  string local_160 [80];
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> local_110;
  byte local_f1;
  int local_f0;
  allocator<char> local_e9;
  string local_e8 [127];
  allocator<char> local_69;
  string local_68 [80];
  Version *local_18;
  
  this = in_RDI;
  local_18 = VersionForDimensionsOf<ZXing::BitMatrix>((BitMatrix *)in_stack_fffffffffffffcf0);
  if (local_18 == (Version *)0x0) {
    paVar3 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (char *)paVar3,in_stack_fffffffffffffd20);
    Error::Error((Error *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 (short)((ulong)in_stack_fffffffffffffd00 >> 0x30),
                 (Type)((ulong)in_stack_fffffffffffffd00 >> 0x28),
                 (string *)
                 CONCAT17(in_stack_fffffffffffffcff,
                          CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)));
    DecoderResult::DecoderResult
              (in_stack_fffffffffffffd00,
               (Error *)CONCAT17(in_stack_fffffffffffffcff,
                                 CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)));
    Error::~Error((Error *)0x26bdce);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  else {
    CodewordsFromBitMatrix(in_stack_fffffffffffffd98,(Version *)in_stack_fffffffffffffd90);
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffd00);
    if (bVar1) {
      paVar3 = &local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 in_stack_fffffffffffffd28,paVar3);
      Error::Error((Error *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                   (short)((ulong)in_stack_fffffffffffffd00 >> 0x30),
                   (Type)((ulong)in_stack_fffffffffffffd00 >> 0x28),
                   (string *)
                   CONCAT17(in_stack_fffffffffffffcff,
                            CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)));
      DecoderResult::DecoderResult
                (in_stack_fffffffffffffd00,
                 (Error *)CONCAT17(in_stack_fffffffffffffcff,
                                   CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)));
      Error::~Error((Error *)0x26bf02);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator(&local_e9);
      local_f0 = 1;
    }
    else {
      local_f1 = 0;
      do {
        GetDataBlocks((ByteArray *)in_stack_fffffffffffffde8,(Version *)in_stack_fffffffffffffde0,
                      (bool)in_stack_fffffffffffffddf);
        bVar1 = std::
                vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                ::empty((vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                         *)in_stack_fffffffffffffd00);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
          Error::Error((Error *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                       (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                       (short)((ulong)in_stack_fffffffffffffd00 >> 0x30),
                       (Type)((ulong)in_stack_fffffffffffffd00 >> 0x28),
                       (string *)
                       CONCAT17(in_stack_fffffffffffffcff,
                                CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)));
          DecoderResult::DecoderResult
                    (in_stack_fffffffffffffd00,
                     (Error *)CONCAT17(in_stack_fffffffffffffcff,
                                       CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)
                                      ));
          Error::~Error((Error *)0x26c056);
          std::__cxx11::string::~string(local_160);
          std::allocator<char>::~allocator(&local_161);
          local_f0 = 1;
        }
        else {
          in_stack_fffffffffffffd14 =
               TransformReduce<std::vector<ZXing::DataMatrix::DataBlock,std::allocator<ZXing::DataMatrix::DataBlock>>,int,ZXing::DataMatrix::DoDecode(ZXing::BitMatrix_const&)::__0>
                         (&local_110,0);
          ByteArray::ByteArray
                    ((ByteArray *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd0c);
          in_stack_fffffffffffffd10 =
               Size<std::vector<ZXing::DataMatrix::DataBlock,std::allocator<ZXing::DataMatrix::DataBlock>>>
                         ((vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                           *)in_stack_fffffffffffffcf0);
          local_1e8._96_4_ = in_stack_fffffffffffffd10;
          for (local_1e8._92_4_ = 0; (int)local_1e8._92_4_ < (int)local_1e8._96_4_;
              local_1e8._92_4_ = local_1e8._92_4_ + 1) {
            local_1e8._80_8_ =
                 std::
                 vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                 ::operator[](&local_110,(long)(int)local_1e8._92_4_);
            bVar1 = CorrectErrors(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
            in_stack_fffffffffffffd0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd0c);
            if (!bVar1) {
              if ((local_18->versionNumber == 0x18) && ((local_f1 & 1) == 0)) {
                local_f1 = 1;
                local_f0 = 2;
              }
              else {
                in_stack_fffffffffffffd00 = (DecoderResult *)local_1e8;
                std::__cxx11::string::string((string *)in_stack_fffffffffffffd00);
                Error::Error((Error *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                             (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                             (short)((ulong)in_stack_fffffffffffffd00 >> 0x30),
                             (Type)((ulong)in_stack_fffffffffffffd00 >> 0x28),
                             (string *)
                             CONCAT17(in_stack_fffffffffffffcff,
                                      CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8))
                            );
                DecoderResult::DecoderResult
                          (in_stack_fffffffffffffd00,
                           (Error *)CONCAT17(in_stack_fffffffffffffcff,
                                             CONCAT16(in_stack_fffffffffffffcfe,
                                                      in_stack_fffffffffffffcf8)));
                Error::~Error((Error *)0x26c26a);
                std::__cxx11::string::~string((string *)local_1e8);
                local_f0 = 1;
              }
              goto LAB_0026c3f4;
            }
            for (local_1ec = 0; local_1ec < *(int *)local_1e8._80_8_; local_1ec = local_1ec + 1) {
              pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  (local_1e8._80_8_ + 8),(long)local_1ec);
              in_stack_fffffffffffffcff = *pvVar2;
              pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  (local_1e8 + 0x68),
                                  (long)(local_1ec * local_1e8._96_4_ + local_1e8._92_4_));
              *pvVar2 = in_stack_fffffffffffffcff;
            }
          }
          in_stack_fffffffffffffcfe = Version::isDMRE(local_18);
          DecodedBitStreamParser::Decode(in_stack_00000098,in_stack_00000097);
          in_stack_fffffffffffffcf0 =
               DecoderResult::setVersionNumber
                         ((DecoderResult *)&stack0xfffffffffffffd40,&local_18->versionNumber);
          DecoderResult::DecoderResult(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
          DecoderResult::~DecoderResult(in_stack_fffffffffffffcf0);
          local_f0 = 1;
LAB_0026c3f4:
          ByteArray::~ByteArray((ByteArray *)0x26c401);
        }
        std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
        ~vector((vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                 *)in_stack_fffffffffffffd00);
      } while (local_f0 == 2);
    }
    ByteArray::~ByteArray((ByteArray *)0x26c44d);
  }
  return in_RDI;
}

Assistant:

static DecoderResult DoDecode(const BitMatrix& bits)
{
	// Construct a parser and read version, error-correction level
	const Version* version = VersionForDimensionsOf(bits);
	if (version == nullptr)
		return FormatError("Invalid matrix dimension");

	// Read codewords
	ByteArray codewords = CodewordsFromBitMatrix(bits, *version);
	if (codewords.empty())
		return FormatError("Invalid number of code words");

	bool fix259 = false; // see https://github.com/zxing-cpp/zxing-cpp/issues/259
retry:
	// Separate into data blocks
	std::vector<DataBlock> dataBlocks = GetDataBlocks(codewords, *version, fix259);
	if (dataBlocks.empty())
		return FormatError("Invalid number of data blocks");

	// Count total number of data bytes
	ByteArray resultBytes(TransformReduce(dataBlocks, 0, [](const auto& db) { return db.numDataCodewords; }));

	// Error-correct and copy data blocks together into a stream of bytes
	const int dataBlocksCount = Size(dataBlocks);
	for (int j = 0; j < dataBlocksCount; j++) {
		auto& [numDataCodewords, codewords] = dataBlocks[j];
		if (!CorrectErrors(codewords, numDataCodewords)) {
			if(version->versionNumber == 24 && !fix259) {
				fix259 = true;
				goto retry;
			}
			return ChecksumError();
		}

		for (int i = 0; i < numDataCodewords; i++) {
			// De-interlace data blocks.
			resultBytes[i * dataBlocksCount + j] = codewords[i];
		}
	}
#ifdef PRINT_DEBUG
	if (fix259)
		printf("-> needed retry with fix259 for 144x144 symbol\n");
#endif

	// Decode the contents of that stream of bytes
	return DecodedBitStreamParser::Decode(std::move(resultBytes), version->isDMRE())
		.setVersionNumber(version->versionNumber);
}